

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
simple_json::Stream::statement_no_return<std::__cxx11::string>
          (Stream *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  Stream *this_local;
  
  statement_indent(this);
  statement_inner<std::__cxx11::string>(this,ts);
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}